

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  int i;
  long lVar3;
  int mask;
  uint uVar4;
  long in_FS_OFFSET;
  
  uVar4 = 0x80;
  lVar3 = 0;
  do {
    if (lVar3 == 4) {
      return dest;
    }
    if ((uVar4 & channel) != 0) {
      iVar2 = stbi__at_eof(s);
      if (iVar2 != 0) {
        *(char **)(in_FS_OFFSET + -0x68) = "PIC file too short";
        return (stbi_uc *)0x0;
      }
      sVar1 = stbi__get8(s);
      dest[lVar3] = sVar1;
    }
    lVar3 = lVar3 + 1;
    uVar4 = uVar4 >> 1;
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}